

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

void icu_63::nscacheInit(void)

{
  UErrorCode status;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_NUMFMT,numfmt_cleanup);
  status = U_ZERO_ERROR;
  NumberingSystem_cache =
       uhash_open_63(uhash_hashLong_63,uhash_compareLong_63,(undefined1 *)0x0,&status);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    uhash_setValueDeleter_63(NumberingSystem_cache,deleteNumberingSystem);
  }
  else {
    NumberingSystem_cache = (UHashtable *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV nscacheInit() {
    U_ASSERT(NumberingSystem_cache == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_NUMFMT, numfmt_cleanup);
    UErrorCode status = U_ZERO_ERROR;
    NumberingSystem_cache = uhash_open(uhash_hashLong,
                                       uhash_compareLong,
                                       NULL,
                                       &status);
    if (U_FAILURE(status)) {
        // Number Format code will run with no cache if creation fails.
        NumberingSystem_cache = NULL;
        return;
    }
    uhash_setValueDeleter(NumberingSystem_cache, deleteNumberingSystem);
}